

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::updateArea(btSoftBody *this,bool averageArea)

{
  Node *pNVar1;
  Face *pFVar2;
  Node *pNVar3;
  int *piVar4;
  byte in_SIL;
  long in_RDI;
  btScalar bVar5;
  int j_1;
  Face *f_2;
  int index;
  int j;
  Face *f_1;
  btAlignedObjectArray<int> counts;
  Face *f;
  int ni;
  int i;
  btAlignedObjectArray<int> *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  int iVar6;
  btAlignedObjectArray<int> *in_stack_ffffffffffffff40;
  btVector3 *in_stack_ffffffffffffff50;
  btVector3 *in_stack_ffffffffffffff58;
  btVector3 *in_stack_ffffffffffffff60;
  int local_6c;
  int local_5c;
  btAlignedObjectArray<int> local_40;
  Face *local_20;
  int local_14;
  int local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_10 = 0;
  local_14 = btAlignedObjectArray<btSoftBody::Face>::size
                       ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0));
  for (; iVar6 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20), local_10 < local_14;
      local_10 = local_10 + 1) {
    local_20 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),local_10);
    bVar5 = AreaOf(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    local_20->m_ra = bVar5;
  }
  if ((local_9 & 1) == 0) {
    local_10 = 0;
    local_14 = btAlignedObjectArray<btSoftBody::Node>::size
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
    for (; local_10 < local_14; local_10 = local_10 + 1) {
      pNVar1 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_10);
      pNVar1->m_area = 0.0;
    }
    local_10 = 0;
    local_14 = btAlignedObjectArray<btSoftBody::Face>::size
                         ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0));
    for (; local_10 < local_14; local_10 = local_10 + 1) {
      pFVar2 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),local_10);
      for (local_6c = 0; local_6c < 3; local_6c = local_6c + 1) {
        pFVar2->m_n[local_6c]->m_area = pFVar2->m_ra + pFVar2->m_n[local_6c]->m_area;
      }
    }
    local_10 = 0;
    local_14 = btAlignedObjectArray<btSoftBody::Node>::size
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
    for (; local_10 < local_14; local_10 = local_10 + 1) {
      pNVar1 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_10);
      pNVar1->m_area = pNVar1->m_area * 0.3333333;
    }
  }
  else {
    btAlignedObjectArray<int>::btAlignedObjectArray(in_stack_ffffffffffffff20);
    btAlignedObjectArray<btSoftBody::Node>::size
              ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
    btAlignedObjectArray<int>::resize(in_stack_ffffffffffffff40,iVar6,in_stack_ffffffffffffff30);
    local_10 = 0;
    local_14 = btAlignedObjectArray<btSoftBody::Node>::size
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
    for (; local_10 < local_14; local_10 = local_10 + 1) {
      pNVar1 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_10);
      pNVar1->m_area = 0.0;
    }
    local_10 = 0;
    local_14 = btAlignedObjectArray<btSoftBody::Face>::size
                         ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0));
    for (; local_10 < local_14; local_10 = local_10 + 1) {
      pFVar2 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),local_10);
      for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
        pNVar1 = pFVar2->m_n[local_5c];
        pNVar3 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),0);
        piVar4 = btAlignedObjectArray<int>::operator[]
                           (&local_40,(int)((ulong)((long)pNVar1 - (long)pNVar3) >> 3) * -0x11111111
                           );
        *piVar4 = *piVar4 + 1;
        bVar5 = btFabs(pFVar2->m_ra);
        pFVar2->m_n[local_5c]->m_area = bVar5 + pFVar2->m_n[local_5c]->m_area;
      }
    }
    local_10 = 0;
    local_14 = btAlignedObjectArray<btSoftBody::Node>::size
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370));
    for (; local_10 < local_14; local_10 = local_10 + 1) {
      piVar4 = btAlignedObjectArray<int>::operator[](&local_40,local_10);
      if (*piVar4 < 1) {
        pNVar1 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_10);
        pNVar1->m_area = 0.0;
      }
      else {
        piVar4 = btAlignedObjectArray<int>::operator[](&local_40,local_10);
        iVar6 = *piVar4;
        pNVar1 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                           ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),local_10);
        pNVar1->m_area = pNVar1->m_area / (float)iVar6;
      }
    }
    btAlignedObjectArray<int>::~btAlignedObjectArray((btAlignedObjectArray<int> *)0x279aee);
  }
  return;
}

Assistant:

void				btSoftBody::updateArea(bool averageArea)
{
	int i,ni;

	/* Face area		*/ 
	for(i=0,ni=m_faces.size();i<ni;++i)
	{
		Face&		f=m_faces[i];
		f.m_ra	=	AreaOf(f.m_n[0]->m_x,f.m_n[1]->m_x,f.m_n[2]->m_x);
	}
	
	/* Node area		*/ 

	if (averageArea)
	{
		btAlignedObjectArray<int>	counts;
		counts.resize(m_nodes.size(),0);
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			m_nodes[i].m_area	=	0;
		}
		for(i=0,ni=m_faces.size();i<ni;++i)
		{
			btSoftBody::Face&	f=m_faces[i];
			for(int j=0;j<3;++j)
			{
				const int index=(int)(f.m_n[j]-&m_nodes[0]);
				counts[index]++;
				f.m_n[j]->m_area+=btFabs(f.m_ra);
			}
		}
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			if(counts[i]>0)
				m_nodes[i].m_area/=(btScalar)counts[i];
			else
				m_nodes[i].m_area=0;
		}
	}
	else
	{
		// initialize node area as zero
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			m_nodes[i].m_area=0;	
		}

		for(i=0,ni=m_faces.size();i<ni;++i)
		{
			btSoftBody::Face&	f=m_faces[i];

			for(int j=0;j<3;++j)
			{
				f.m_n[j]->m_area += f.m_ra;
			}
		}

		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			m_nodes[i].m_area *= 0.3333333f;
		}
	}
}